

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O2

Vec_Vec_t * Cgt_ManDecideSimple(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Vec_t *vGates;
  Ssw_Sml_t *p;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pCand;
  abctime aVar5;
  int iVar6;
  int iVar7;
  int i;
  Aig_Obj_t *Entry;
  float fVar8;
  uint local_70;
  
  aVar4 = Abc_Clock();
  vGates = Vec_VecStart(pAig->nRegs);
  p = Ssw_SmlSimulateSeq(pAig,0,0x20,1);
  local_70 = 0;
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pObjLi = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
    pObjLo = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    p_00 = Vec_VecEntry(vGatesAll,iVar6);
    Entry = (Aig_Obj_t *)0x0;
    iVar7 = 0;
    for (i = 0; i < p_00->nSize; i = i + 1) {
      pCand = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
      if ((nOdcMax == 0) && (iVar1 = Ssw_SmlCheckXorImplication(p,pObjLi,pObjLo,pCand), iVar1 == 0))
      {
        puts("Clock gate candidate is invalid!");
      }
      iVar2 = Ssw_SmlNodeCountOnesReal(p,pCand);
      iVar1 = iVar7;
      if (iVar7 <= iVar2) {
        iVar1 = iVar2;
      }
      if (iVar7 < iVar2) {
        Entry = pCand;
      }
      iVar7 = iVar1;
    }
    if (Entry != (Aig_Obj_t *)0x0) {
      Vec_VecPush(vGates,iVar6,Entry);
      local_70 = local_70 + 1;
    }
  }
  Ssw_SmlStop(p);
  if (fVerbose != 0) {
    uVar3 = Vec_VecSizeSize(vGatesAll);
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",(ulong)uVar3,
           (ulong)local_70,(ulong)(uint)pAig->nRegs);
    fVar8 = Cgt_ManComputeCoverage(pAig,vGates);
    iVar6 = 0x7550ab;
    printf("Gated transitions = %5.2f %%. ",(double)fVar8);
    Abc_Print(iVar6,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
  }
  return vGates;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideSimple( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    int nFrames = 32;
    int nWords  =  1;
    Ssw_Sml_t * pSml;
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObjLi, * pObjLo, * pCand, * pCandBest;
    int i, k, nHitsCur, nHitsMax, Counter = 0;
    abctime clk = Abc_Clock();
    int nTransTotal = 0, nTransSaved = 0;
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        nHitsMax = 0;
        pCandBest = NULL;
        vCands = Vec_VecEntry( vGatesAll, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pCand, k )
        {
            // check if this is indeed a clock-gate
            if ( nOdcMax == 0 && !Ssw_SmlCheckXorImplication( pSml, pObjLi, pObjLo, pCand ) )
                printf( "Clock gate candidate is invalid!\n" );
            // find its characteristic number
            nHitsCur = Ssw_SmlNodeCountOnesReal( pSml, pCand );
            if ( nHitsMax < nHitsCur )
            {
                nHitsMax = nHitsCur;
                pCandBest = pCand;
            }
        }
        if ( pCandBest != NULL )
        {
            Vec_VecPush( vGates, i, pCandBest );
            Counter++;
            nTransSaved += nHitsMax;
        }
        nTransTotal += 32 * nFrames * nWords;
    }
    Ssw_SmlStop( pSml );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
//        printf( "Gated transitions = %5.2f %%. (%5.2f %%.) ", 
//            100.0*nTransSaved/nTransTotal, Cgt_ManComputeCoverage(pAig, vGates) );
        printf( "Gated transitions = %5.2f %%. ", Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
/*
    {
        Vec_Ptr_t * vCompletes;
        vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
        printf( "Complete gates = %d. \n", Vec_PtrSize(vCompletes) );
        Vec_PtrFree( vCompletes );
    }
*/
    return vGates;
}